

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

string * __thiscall
pbrt::CameraSample::ToString_abi_cxx11_(string *__return_storage_ptr__,CameraSample *this)

{
  float *unaff_RBX;
  
  StringPrintf<pbrt::Point2<float>const&,pbrt::Point2<float>const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ pFilm: %s pLens: %s time: %f weight: %f ]",
             (char *)this,&this->pLens,(Point2<float> *)&this->time,&this->weight,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string CameraSample::ToString() const {
    return StringPrintf("[ pFilm: %s pLens: %s time: %f weight: %f ]", pFilm, pLens, time,
                        weight);
}